

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Set_Value(Am_Object *inter,bool set_selected)

{
  bool bVar1;
  Am_Value *pAVar2;
  void *this;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  undefined1 local_60 [6];
  Am_Value_Type old_value_type;
  Am_Value_List old_value_list;
  Am_Object old_value_obj;
  Am_Value old_value;
  Am_Choice_How_Set local_28;
  Am_Choice_How_Set how_set;
  Am_Object new_value;
  bool set_selected_local;
  Am_Object *inter_local;
  
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object((Am_Object *)&how_set,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set(&local_28,pAVar2);
  Am_Value::Am_Value((Am_Value *)&old_value_obj);
  Am_Object::Am_Object((Am_Object *)&old_value_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_60);
  pAVar2 = Am_Object::Peek(inter,0x169,0);
  Am_Value::operator=((Am_Value *)&old_value_obj,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&old_value_obj);
  if (bVar1) {
    if ((Am_Value_Type)old_value_obj.data == 0xa001) {
      Am_Object::operator=((Am_Object *)&old_value_list.item,(Am_Value *)&old_value_obj);
    }
    else {
      bVar1 = Am_Value_List::Test((Am_Value *)&old_value_obj);
      if (!bVar1) {
        std::operator<<((ostream *)&std::cerr,"** Amulet Error: Bad type ");
        Am_Print_Type((ostream *)&std::cerr,(Am_Value_Type)old_value_obj.data);
        poVar4 = std::operator<<((ostream *)&std::cerr," in VALUE of inter ");
        poVar4 = operator<<(poVar4,inter);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = operator<<(poVar4,(Am_Value *)&old_value_obj);
        this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Value_List::operator=((Am_Value_List *)local_60,(Am_Value *)&old_value_obj);
    }
  }
  if ((Am_Value_Type)old_value_obj.data == 0xa001) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&old_value_list.item);
    Am_Object::Set(inter,0x16c,pAVar3,1);
  }
  else {
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_60);
    Am_Object::Set(inter,0x16c,pAVar3,1);
  }
  bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_LIST_TOGGLE);
  if (bVar1) {
    if ((Am_Value_Type)old_value_obj.data == 0xa001) {
      bVar1 = Am_Object::operator==((Am_Object *)&old_value_list.item,(Am_Object *)&how_set);
      if (bVar1) {
        if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item), bVar1))
        {
          Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
        }
      }
      else {
        bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&old_value_list.item);
          Am_Value_List::Add((Am_Value_List *)local_60,pAVar3,Am_TAIL,true);
        }
        bVar1 = Am_Object::Valid((Am_Object *)&how_set);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
          Am_Value_List::Add((Am_Value_List *)local_60,pAVar3,Am_TAIL,true);
          if (set_selected) {
            Am_Object::Set((Am_Object *)&how_set,0x172,true,1);
          }
        }
      }
      pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_60);
      Am_Object::Set(inter,0x169,pAVar3,0);
    }
    else {
      Am_Value_List::Start((Am_Value_List *)local_60);
      bVar1 = Am_Object::Valid((Am_Object *)&how_set);
      if (bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
        bVar1 = Am_Value_List::Member((Am_Value_List *)local_60,pAVar3);
        if (bVar1) {
          if (set_selected) {
            Am_Object::Set((Am_Object *)&how_set,0x172,false,1);
          }
          Am_Value_List::Delete((Am_Value_List *)local_60,true);
          bVar1 = Am_Value_List::Empty((Am_Value_List *)local_60);
          if (bVar1) {
            pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
            Am_Object::Set(inter,0x169,pAVar3,0);
          }
          else {
            pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_60);
            Am_Object::Set(inter,0x169,pAVar3,0);
          }
        }
        else {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
          Am_Value_List::Add((Am_Value_List *)local_60,pAVar3,Am_TAIL,true);
          if (set_selected) {
            Am_Object::Set((Am_Object *)&how_set,0x172,true,1);
          }
          pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_60);
          Am_Object::Set(inter,0x169,pAVar3,0);
        }
      }
    }
    goto LAB_00231ff9;
  }
  if ((Am_Value_Type)old_value_obj.data == 0xa001) {
    bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_SET);
    if (bVar1) {
      if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item), bVar1)) {
        Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
      }
      if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&how_set), bVar1)) {
        Am_Object::Set((Am_Object *)&how_set,0x172,true,1);
      }
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
      Am_Object::Set(inter,0x169,pAVar3,0);
    }
    else {
      bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_CLEAR);
      if (bVar1) {
        if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item), bVar1))
        {
          Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
        }
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
        Am_Object::Set(inter,0x169,pAVar3,0);
      }
      else {
        bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_TOGGLE);
        if (!bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet Error: Illegal how_set ");
          poVar4 = operator<<(poVar4,&local_28);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        bVar1 = Am_Object::operator==((Am_Object *)&old_value_list.item,(Am_Object *)&how_set);
        if (bVar1) {
          if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item), bVar1)
             ) {
            Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
          }
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
          Am_Object::Set(inter,0x169,pAVar3,0);
        }
        else {
          if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&old_value_list.item), bVar1)
             ) {
            Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
          }
          if ((set_selected) && (bVar1 = Am_Object::Valid((Am_Object *)&how_set), bVar1)) {
            Am_Object::Set((Am_Object *)&how_set,0x172,true,1);
          }
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
          Am_Object::Set(inter,0x169,pAVar3,0);
        }
      }
    }
    goto LAB_00231ff9;
  }
  Am_Value_List::Start((Am_Value_List *)local_60);
  bVar1 = Am_Object::Valid((Am_Object *)&how_set);
  if (bVar1) {
    bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_CLEAR);
    if (bVar1) {
LAB_00231ee9:
      Am_Object::operator=((Am_Object *)&how_set,&Am_No_Object);
    }
    else {
      bVar1 = Am_Choice_How_Set::operator==(&local_28,Am_CHOICE_LIST_TOGGLE);
      if (bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
        bVar1 = Am_Value_List::Member((Am_Value_List *)local_60,pAVar3);
        if (bVar1) goto LAB_00231ee9;
      }
      if (set_selected) {
        Am_Object::Set((Am_Object *)&how_set,0x172,true,1);
      }
    }
  }
  Am_Value_List::Start((Am_Value_List *)local_60);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_60);
    Am_Object::operator=((Am_Object *)&old_value_list.item,pAVar2);
    if ((set_selected) &&
       (bVar1 = Am_Object::operator!=((Am_Object *)&old_value_list.item,(Am_Object *)&how_set),
       bVar1)) {
      Am_Object::Set((Am_Object *)&old_value_list.item,0x172,false,1);
    }
    Am_Value_List::Next((Am_Value_List *)local_60);
  }
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&how_set);
  Am_Object::Set(inter,0x169,pAVar3,0);
LAB_00231ff9:
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
  Am_Object::~Am_Object((Am_Object *)&old_value_list.item);
  Am_Value::~Am_Value((Am_Value *)&old_value_obj);
  Am_Object::~Am_Object((Am_Object *)&how_set);
  return;
}

Assistant:

void
Am_Choice_Set_Value(Am_Object inter, bool set_selected)
{
  Am_Object new_value = inter.Get(Am_INTERIM_VALUE);
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);

  // now set real value

  // first check if slot contains correct type: single object or list
  Am_Value old_value;
  Am_Object old_value_obj;
  Am_Value_List old_value_list;
  old_value = inter.Peek(Am_VALUE);
  Am_Value_Type old_value_type = old_value.type;
  // if not valid, old_value_obj and old_value_list already are not valid
  if (old_value.Valid()) {
    if (old_value_type == Am_OBJECT)
      old_value_obj = old_value;
    else if (Am_Value_List::Test(old_value))
      old_value_list = old_value;
    else {
      std::cerr << "** Amulet Error: Bad type ";
      Am_Print_Type(std::cerr, old_value_type);
      std::cerr << " in VALUE of inter " << inter << " = " << old_value
                << std::endl
                << std::flush;
      Am_Error();
    }
  }

  //save current value as old in case needed for undo
  if (old_value_type == Am_OBJECT)
    inter.Set(Am_OLD_VALUE, old_value_obj, Am_OK_IF_NOT_THERE);
  else
    inter.Set(Am_OLD_VALUE, old_value_list, Am_OK_IF_NOT_THERE);

  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    if (old_value_type == Am_OBJECT) {
      // used to be a single value, might become a list
      if (old_value_obj == new_value) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false,
                            Am_OK_IF_NOT_THERE); // and leave new list empty
        }
      } else { // old value is a list
        // put them both in the new list
        if (old_value_obj.Valid())
          old_value_list.Add(old_value_obj);
        if (new_value.Valid()) {
          old_value_list.Add(new_value);
          if (set_selected) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      //put new list into slot.
      inter.Set(Am_VALUE, old_value_list);
    } else {
      // originally a list, will stay a list or get cleared
      old_value_list.Start(); // initialize list for Member or for loop
      if (!new_value.Valid()) {
      } /*  Don't do anything *********
	       // { // clear out list
	       // // clear all the SELECTED slots of the individual objects
	       // for ( ; !old_value_list.Last (); old_value_list.Next ()) {
	       // old_value_obj = old_value_list.Get ();
	       // Am_REPORT_SET_SEL_VALUE (true, inter, old_value_obj, false);
	       // old_value_obj.Set (Am_SELECTED, false);
	       // }
	       // // forget about the list; just make it an empty object.
	       // inter.Set (Am_VALUE, new_value);
	       // } // end of if (!new_value)
      */
      // old_value_list exists, new_value exists
      else if (old_value_list.Member(new_value)) {
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, false);
          new_value.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        old_value_list.Delete();
        if (old_value_list.Empty())
          // no objects left in list, so don't store empty list
          inter.Set(Am_VALUE, Am_No_Value_List);
        else
          inter.Set(Am_VALUE, old_value_list);
      } else { // add it at end
        old_value_list.Add(new_value);
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, old_value_list);
      }
    }
  }      // end of how_set == List toggle
  else { // single value
    if (old_value_type == Am_OBJECT) {
      // single new value, single old value
      if (how_set == Am_CHOICE_SET) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        if (set_selected && new_value.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, new_value); // put new value into slot
      } else if (how_set == Am_CHOICE_CLEAR) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, Am_No_Object); // empty
      } else if (how_set == Am_CHOICE_TOGGLE) {
        if (old_value_obj == new_value) {
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, Am_No_Object); // empty
        } else {                             // set with new value
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          if (set_selected && new_value.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, new_value); // put new value into slot
        }
      } else {
        std::cerr << "** Amulet Error: Illegal how_set " << how_set
                  << std::endl;
        Am_Error();
      }
    } else {
      // used to be multiple values, now is just one
      old_value_list.Start(); // set pointer back to the beginning
      // see if new object should NOT be in the set
      if (new_value.Valid()) {
        if ((how_set == Am_CHOICE_CLEAR) || (how_set == Am_CHOICE_LIST_TOGGLE &&
                                             old_value_list.Member(new_value)))
          new_value = Am_No_Object;
        else {
          if (set_selected) {
            // item must be selected if not previously in list or being cleared
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      for (old_value_list.Start(); !old_value_list.Last();
           old_value_list.Next()) {
        old_value_obj = old_value_list.Get();
        if (set_selected && old_value_obj != new_value) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          //clear all the other values
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
      }
      //put new value into slot. Will automatically deallocate old_value_list
      inter.Set(Am_VALUE, new_value);
    } // else single old value
  }   // else single new value
}